

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O2

void __thiscall
QPDFExc::QPDFExc(QPDFExc *this,qpdf_error_code_e error_code,string *filename,string *object,
                qpdf_offset_t offset,string *message)

{
  ulong offset_00;
  string local_50;
  
  offset_00 = -(ulong)(offset == 0) | offset;
  createWhat(&local_50,filename,object,offset_00,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__QPDFExc_002aed98;
  this->error_code = error_code;
  std::__cxx11::string::string((string *)&this->filename,(string *)filename);
  std::__cxx11::string::string((string *)&this->object,(string *)object);
  this->offset = offset_00;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  return;
}

Assistant:

QPDFExc::QPDFExc(
    qpdf_error_code_e error_code,
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message) :
    std::runtime_error(createWhat(filename, object, (offset ? offset : -1), message)),
    error_code(error_code),
    filename(filename),
    object(object),
    offset(offset ? offset : -1),
    message(message)
{
}